

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O3

void __thiscall Js::StackScriptFunction::BoxState::Finish(BoxState *this)

{
  Type *pTVar1;
  int iVar2;
  Type piVar3;
  Type pSVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar5 = (ulong)(this->frameToBox).
                 super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 .bucketCount;
  if (uVar5 != 0) {
    piVar3 = (this->frameToBox).
             super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .buckets;
    pSVar4 = (this->frameToBox).
             super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .entries;
    uVar6 = 0;
    do {
      iVar7 = piVar3[uVar6];
      while (iVar7 != -1) {
        iVar2 = pSVar4[iVar7].
                super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
                super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::FunctionBody_*>_>
                .super_ValueEntryData<Js::FunctionBody_*>.next;
        pTVar1 = &((pSVar4[iVar7].
                    super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                    .super_ImplicitKeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
                    super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::FunctionBody_*>_>
                    .super_ValueEntryData<Js::FunctionBody_*>.value)->super_ParseableFunctionInfo).
                  flags;
        *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|
                             Flags_HasOnlyThisStatements|Flags_NonUserCode|Flags_HasThis|
                             Flags_HasTry|Flags_HasOrParentHasArguments);
        iVar7 = iVar2;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

void StackScriptFunction::BoxState::Finish()
    {
        frameToBox.Map([](FunctionBody * body)
        {
            body->SetStackNestedFunc(false);
        });
    }